

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::ReadPixelsCase::iterate(ReadPixelsCase *this)

{
  uint uVar1;
  RenderContext *context;
  TestLog *this_00;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int width;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  GLenum err;
  uint uVar8;
  int iVar9;
  RenderTarget *pRVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  Surface *pSVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  byte bVar20;
  Surface refImage;
  Surface resImage;
  deRandom rnd;
  Surface diffImage;
  uint local_39c;
  char local_390;
  char local_388;
  char local_384;
  Surface local_380;
  Surface local_368;
  ulong local_350;
  deRandom local_348;
  string local_338;
  string local_318;
  string local_2f8;
  Surface local_2d8;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  LogImageSet local_220;
  LogImage local_1e0;
  LogImage local_150;
  LogImage local_c0;
  
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar19 = (pRVar10->m_pixelFormat).redBits;
  iVar9 = (pRVar10->m_pixelFormat).greenBits;
  iVar17 = (pRVar10->m_pixelFormat).blueBits;
  iVar18 = (pRVar10->m_pixelFormat).alphaBits;
  width = pRVar10->m_width;
  uVar8 = pRVar10->m_height;
  uVar13 = (ulong)uVar8;
  uVar4 = ((uint)this->m_curIter >> 0x10 ^ this->m_curIter ^ 0x3d) * 9;
  uVar4 = (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d;
  deRandom_init(&local_348,uVar4 >> 0xf ^ uVar4);
  iVar15 = this->m_curIter;
  if (iVar15 == 0) {
    uVar4 = 0;
    local_39c = 0;
  }
  else if (iVar15 == 2) {
    local_39c = width / 2;
    uVar4 = (int)uVar8 / 2;
    width = width - local_39c;
    uVar13 = (ulong)(uVar8 - uVar4);
  }
  else if (iVar15 == 1) {
    width = width / 2;
    uVar4 = 0;
    uVar13 = (ulong)(uint)((int)uVar8 / 2);
    local_39c = 0;
  }
  else {
    dVar5 = deRandom_getUint32(&local_348);
    local_39c = dVar5 % (width - 1U);
    dVar5 = deRandom_getUint32(&local_348);
    uVar4 = dVar5 % (uVar8 - 1);
    dVar5 = deRandom_getUint32(&local_348);
    width = dVar5 % (~local_39c + width) + 1;
    dVar5 = deRandom_getUint32(&local_348);
    uVar13 = (ulong)(dVar5 % (~uVar4 + uVar8) + 1);
  }
  iVar15 = (int)uVar13;
  tcu::Surface::Surface(&local_368,width,iVar15);
  tcu::Surface::Surface(&local_380,width,iVar15);
  local_350 = uVar13;
  tcu::Surface::Surface(&local_2d8,width,iVar15);
  dVar5 = deRandom_getUint32(&local_348);
  dVar6 = deRandom_getUint32(&local_348);
  dVar7 = deRandom_getUint32(&local_348);
  local_150.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
    local_380.m_pixels.m_cap = (size_t)local_380.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_1e0,(TextureFormat *)&local_150,local_380.m_width,
             local_380.m_height,1,(void *)local_380.m_pixels.m_cap);
  local_150.m_name._M_dataplus._M_p = (pointer)(CONCAT44(dVar6,dVar5) & 0xff000000ff);
  local_150.m_name._M_string_length._4_4_ = 0xff;
  local_150.m_name._M_string_length._0_4_ = dVar7 & 0xff;
  tcu::clear((PixelBufferAccess *)&local_1e0,(IVec4 *)&local_150);
  glwClearColor((float)(dVar5 & 0xff) / 255.0,(float)(dVar6 & 0xff) / 255.0,
                (float)(dVar7 & 0xff) / 255.0,1.0);
  glwClear(0x4000);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_150.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
    local_368.m_pixels.m_cap = (size_t)local_368.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_1e0,(TextureFormat *)&local_150,local_368.m_width,
             local_368.m_height,1,(void *)local_368.m_pixels.m_cap);
  glu::readPixels(context,local_39c,uVar4,(PixelBufferAccess *)&local_1e0);
  err = glwGetError();
  glu::checkError(err,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPrerequisiteTests.cpp"
                  ,0xe8);
  iVar15 = 0;
  uVar8 = 0x1000000 << (8U - (char)iVar18 & 0x1f);
  if (iVar18 < 1) {
    uVar8 = 0;
  }
  local_388 = (char)iVar9;
  local_384 = (char)iVar17;
  if (0 < (int)local_350) {
    local_390 = (char)iVar19;
    bVar20 = 1;
    uVar13 = local_350;
    do {
      if (0 < width) {
        iVar19 = 0;
        do {
          uVar4 = *(uint *)((long)local_368.m_pixels.m_ptr +
                           (long)(local_368.m_width * iVar15 + iVar19) * 4);
          uVar1 = *(uint *)((long)local_380.m_pixels.m_ptr +
                           (long)(local_380.m_width * iVar15 + iVar19) * 4);
          if (uVar1 == uVar4) {
            uVar11 = 0xff00ff00;
            bVar3 = true;
          }
          else {
            uVar16 = (uVar1 & 0xff) - (uVar4 & 0xff);
            uVar2 = -uVar16;
            if (0 < (int)uVar16) {
              uVar2 = uVar16;
            }
            iVar17 = (uVar1 >> 8 & 0xff) - (uVar4 >> 8 & 0xff);
            iVar9 = -iVar17;
            if (0 < iVar17) {
              iVar9 = iVar17;
            }
            iVar18 = (uVar1 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff);
            iVar17 = -iVar18;
            if (0 < iVar18) {
              iVar17 = iVar18;
            }
            iVar12 = (uVar1 >> 0x18) - (uVar4 >> 0x18);
            iVar18 = -iVar12;
            if (0 < iVar12) {
              iVar18 = iVar12;
            }
            local_1e0.m_name._M_dataplus._M_p._0_4_ =
                 iVar17 << 0x10 | iVar9 << 8 | iVar18 << 0x18 | uVar2;
            bVar3 = tcu::RGBA::isBelowThreshold
                              ((RGBA *)&local_1e0,
                               (RGBA)(0x100 << (8U - local_388 & 0x1f) |
                                      1 << ((byte)(8 - local_390) & 0x1f) |
                                      0x10000 << (8U - local_384 & 0x1f) | uVar8));
            uVar11 = 0xff0000ff;
            if (bVar3) {
              uVar11 = 0xff00ff00;
            }
          }
          bVar20 = bVar20 & bVar3;
          *(undefined4 *)
           ((long)local_2d8.m_pixels.m_ptr + (long)(local_2d8.m_width * iVar15 + iVar19) * 4) =
               uVar11;
          iVar19 = iVar19 + 1;
          uVar13 = local_350;
        } while (width != iVar19);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != (int)uVar13);
    if (bVar20 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
      this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Result","");
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"Resulting framebuffer","");
      tcu::LogImageSet::LogImageSet(&local_220,&local_240,&local_260);
      tcu::TestLog::startImageSet
                (this_00,local_220.m_name._M_dataplus._M_p,local_220.m_description._M_dataplus._M_p)
      ;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Result","");
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Resulting framebuffer","");
      pSVar14 = &local_368;
      tcu::LogImage::LogImage
                (&local_1e0,&local_280,&local_2f8,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar19 = (int)this_00;
      tcu::LogImage::write(&local_1e0,iVar19,__buf,(size_t)pSVar14);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Reference","");
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Reference image","");
      pSVar14 = &local_380;
      tcu::LogImage::LogImage
                (&local_150,&local_318,&local_338,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_150,iVar19,__buf_00,(size_t)pSVar14);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"DiffMask","");
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Failing pixels","");
      pSVar14 = &local_2d8;
      tcu::LogImage::LogImage
                (&local_c0,&local_2a0,&local_2c0,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_c0,iVar19,__buf_01,(size_t)pSVar14);
      tcu::TestLog::endImageSet(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
        operator_delete(local_c0.m_description._M_dataplus._M_p,
                        local_c0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
        operator_delete(local_c0.m_name._M_dataplus._M_p,
                        local_c0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.m_description._M_dataplus._M_p != &local_150.m_description.field_2) {
        operator_delete(local_150.m_description._M_dataplus._M_p,
                        local_150.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.m_name._M_dataplus._M_p != &local_150.m_name.field_2) {
        operator_delete(local_150.m_name._M_dataplus._M_p,
                        local_150.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.m_description._M_dataplus._M_p != &local_1e0.m_description.field_2) {
        operator_delete(local_1e0.m_description._M_dataplus._M_p,
                        local_1e0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e0.m_name._M_dataplus._M_p._4_4_,
                      (uint)local_1e0.m_name._M_dataplus._M_p) != &local_1e0.m_name.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e0.m_name._M_dataplus._M_p._4_4_,
                                 (uint)local_1e0.m_name._M_dataplus._M_p),
                        local_1e0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_description._M_dataplus._M_p != &local_220.m_description.field_2) {
        operator_delete(local_220.m_description._M_dataplus._M_p,
                        local_220.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.m_name._M_dataplus._M_p != &local_220.m_name.field_2) {
        operator_delete(local_220.m_name._M_dataplus._M_p,
                        local_220.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002d3f0b;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_002d3f0b:
  iVar9 = this->m_curIter + 1;
  this->m_curIter = iVar9;
  iVar19 = this->m_numIters;
  tcu::Surface::~Surface(&local_2d8);
  tcu::Surface::~Surface(&local_380);
  tcu::Surface::~Surface(&local_368);
  return (IterateResult)(iVar9 < iVar19);
}

Assistant:

TestCase::IterateResult ReadPixelsCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	tcu::PixelFormat			pixelFormat		= renderTarget.getPixelFormat();
	int							targetWidth		= renderTarget.getWidth();
	int							targetHeight	= renderTarget.getHeight();
	int							x				= 0;
	int							y				= 0;
	int							imageWidth		= 0;
	int							imageHeight		= 0;

	deRandom rnd;
	deRandom_init(&rnd, deInt32Hash(m_curIter));

	switch (m_curIter)
	{
		case 0:
			// Fullscreen
			x = 0;
			y = 0;
			imageWidth  = targetWidth;
			imageHeight = targetHeight;
			break;
		case 1:
			// Upper left corner
			x = 0;
			y = 0;
			imageWidth = targetWidth / 2;
			imageHeight = targetHeight / 2;
			break;
		case 2:
			// Lower right corner
			x = targetWidth / 2;
			y = targetHeight / 2;
			imageWidth = targetWidth - x;
			imageHeight = targetHeight - y;
			break;
		default:
			x = deRandom_getUint32(&rnd) % (targetWidth - 1);
			y = deRandom_getUint32(&rnd) % (targetHeight - 1);
			imageWidth = 1 + (deRandom_getUint32(&rnd) % (targetWidth - x - 1));
			imageHeight = 1 + (deRandom_getUint32(&rnd) % (targetHeight - y - 1));
			break;
	}

	Surface	resImage(imageWidth, imageHeight);
	Surface	refImage(imageWidth, imageHeight);
	Surface	diffImage(imageWidth, imageHeight);

	int r = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int g = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int b = (int)(deRandom_getUint32(&rnd) & 0xFF);

	tcu::clear(refImage.getAccess(), tcu::IVec4(r, g, b, 255));
	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	glu::readPixels(m_context.getRenderContext(), x, y, resImage.getAccess());
	GLU_CHECK_MSG("glReadPixels() failed.");

	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	bool isImageOk = true;

	for (int j = 0; j < imageHeight; j++)
	{
		for (int i = 0; i < imageWidth; i++)
		{
			RGBA		resRGBA		= resImage.getPixel(i, j);
			RGBA		refRGBA		= refImage.getPixel(i, j);
			bool		isPixelOk	= compareThreshold(refRGBA, resRGBA, colorThreshold);
			diffImage.setPixel(i, j, isPixelOk ? matchColor : diffColor);

			isImageOk = isImageOk && isPixelOk;
		}
	}

	if (isImageOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		TestLog& log = m_testCtx.getLog();
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
	}

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}